

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O2

b_str<char32_t> *
detail::operator|(b_str<char32_t> *__return_storage_ptr__,b_str<char32_t> *str,
                 split_helper_subroutine<detail::get_back,_char32_t,_char32_t> *info)

{
  size_type sVar1;
  
  sVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::find
                    (str,info->delim,0);
  if (sVar1 != 0xffffffffffffffff) {
    sVar1 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::rfind
                      (str,info->delim,0xffffffffffffffff);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    erase(str,0,sVar1 + 1);
  }
  std::__cxx11::u32string::u32string(__return_storage_ptr__,str);
  return __return_storage_ptr__;
}

Assistant:

b_str<CharType> operator| (b_str<CharType>&& str, const split_helper_subroutine<get_back, DelimType, CharType>& info)
	{
		const auto pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos != pos) str.erase(0, str.find_last_of(info.delim) + 1);
		return std::move(str);
	}